

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O1

int mz_uncompress(uchar *pDest,mz_ulong *pDest_len,uchar *pSource,mz_ulong source_len)

{
  int iVar1;
  int iVar2;
  size_t extraout_RDX;
  undefined1 auStack_98 [8];
  mz_stream stream;
  
  stream.data_type = 0;
  stream._92_4_ = 0;
  stream.adler = 0;
  stream.zfree = (mz_free_func)0x0;
  stream.opaque = (void *)0x0;
  stream.state = (mz_internal_state *)0x0;
  stream.zalloc = (mz_alloc_func)0x0;
  stream.total_out = 0;
  stream.msg = (char *)0x0;
  stream.avail_out = 0;
  stream._36_4_ = 0;
  stream.avail_in = 0;
  stream._12_4_ = 0;
  iVar1 = -10000;
  if ((*pDest_len | source_len) >> 0x20 == 0) {
    stream.next_in = (uchar *)(source_len & 0xffffffff);
    stream.next_out = (uchar *)(*pDest_len & 0xffffffff);
    auStack_98 = (undefined1  [8])pSource;
    stream.total_in = (mz_ulong)pDest;
    iVar1 = mz_inflateInit2((mz_streamp)auStack_98,0xf);
    if (iVar1 == 0) {
      iVar2 = mz_inflate((mz_streamp)auStack_98,4);
      if (iVar2 == 1) {
        *pDest_len = stream._32_8_;
        iVar1 = 0;
        if (stream.msg != (char *)0x0) {
          (*stream.zalloc)(stream.zfree,(size_t)stream.msg,extraout_RDX);
        }
      }
      else {
        if (stream.msg != (char *)0x0) {
          (*stream.zalloc)(stream.zfree,(size_t)stream.msg,extraout_RDX);
        }
        iVar1 = -3;
        if (iVar2 != -5 || (int)stream.next_in != 0) {
          iVar1 = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mz_uncompress(unsigned char *pDest, mz_ulong *pDest_len, const unsigned char *pSource,
    mz_ulong source_len)
{
    mz_stream stream;
    int status;
    memset(&stream, 0, sizeof(stream));

    // In case mz_ulong is 64-bits (argh I hate longs).
    if ((source_len | *pDest_len) > 0xFFFFFFFFU)
        return MZ_PARAM_ERROR;

    stream.next_in = pSource;
    stream.avail_in = (mz_uint32)source_len;
    stream.next_out = pDest;
    stream.avail_out = (mz_uint32) * pDest_len;

    status = mz_inflateInit(&stream);
    if (status != MZ_OK)
        return status;

    status = mz_inflate(&stream, MZ_FINISH);
    if (status != MZ_STREAM_END)
    {
        mz_inflateEnd(&stream);
        return ((status == MZ_BUF_ERROR) && (!stream.avail_in)) ? MZ_DATA_ERROR : status;
    }
    *pDest_len = stream.total_out;

    return mz_inflateEnd(&stream);
}